

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall sector_t::FindNextLowestCeiling(sector_t *this,vertex_t **v)

{
  line_t_conflict *line;
  bool bVar1;
  sector_t_conflict *other_00;
  double dVar2;
  double dVar3;
  int local_5c;
  int i;
  line_t_conflict *check;
  vertex_t *spot;
  sector_t_conflict *other;
  double ceil;
  double oceil;
  double heightdiff;
  double height;
  vertex_t **v_local;
  sector_t_conflict *this_local;
  
  if (this->linecount == 0) {
    this_local = (sector_t_conflict *)GetPlaneTexZ(this,1);
  }
  else {
    check = (line_t_conflict *)(*this->lines)->v1;
    heightdiff = secplane_t::ZatPoint(&this->ceilingplane,(vertex_t *)check);
    oceil = 3.4028234663852886e+38;
    for (local_5c = 0; local_5c < this->linecount; local_5c = local_5c + 1) {
      line = this->lines[local_5c];
      other_00 = getNextSector(line,(sector_t_conflict *)this);
      if (other_00 != (sector_t_conflict *)0x0) {
        dVar2 = secplane_t::ZatPoint(&other_00->ceilingplane,line->v1);
        dVar3 = secplane_t::ZatPoint(&this->ceilingplane,line->v1);
        if (((dVar2 < dVar3) && (dVar3 - dVar2 < oceil)) &&
           (bVar1 = IsLinked(this,other_00,true), !bVar1)) {
          oceil = dVar3 - dVar2;
          check = (line_t_conflict *)line->v1;
          heightdiff = dVar2;
        }
        dVar2 = secplane_t::ZatPoint(&other_00->ceilingplane,line->v2);
        dVar3 = secplane_t::ZatPoint(&this->ceilingplane,line->v2);
        if (((dVar2 < dVar3) && (dVar3 - dVar2 < oceil)) &&
           (bVar1 = IsLinked(this,other_00,true), !bVar1)) {
          oceil = dVar3 - dVar2;
          check = (line_t_conflict *)line->v2;
          heightdiff = dVar2;
        }
      }
    }
    if (v != (vertex_t **)0x0) {
      *v = (vertex_t *)check;
    }
    this_local = (sector_t_conflict *)heightdiff;
  }
  return (double)this_local;
}

Assistant:

double sector_t::FindNextLowestCeiling (vertex_t **v) const
{
	double height;
	double heightdiff;
	double oceil, ceil;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;


	if (linecount == 0) return GetPlaneTexZ(sector_t::ceiling);

	spot = lines[0]->v1;
	height = ceilingplane.ZatPoint(spot);
	heightdiff = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			oceil = other->ceilingplane.ZatPoint(check->v1);
			ceil = ceilingplane.ZatPoint(check->v1);
			if (oceil < ceil && ceil - oceil < heightdiff && !IsLinked(other, true))
			{
				heightdiff = ceil - oceil;
				height = oceil;
				spot = check->v1;
			}
			oceil = other->ceilingplane.ZatPoint(check->v2);
			ceil = ceilingplane.ZatPoint(check->v2);
			if (oceil < ceil && ceil - oceil < heightdiff && !IsLinked(other, true))
			{
				heightdiff = ceil - oceil;
				height = oceil;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}